

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd_analyze.hpp
# Opt level: O1

bool duckdb::AlpRDAnalyze<double>(AnalyzeState *state,Vector *input,idx_t count)

{
  _func_int **pp_Var1;
  _func_int **pp_Var2;
  value_type vVar3;
  iterator __position;
  uint uVar4;
  reference pvVar5;
  reference pvVar6;
  ulong uVar7;
  undefined8 uVar8;
  ulong uVar9;
  size_type sVar10;
  unsigned_long val;
  ulong uVar11;
  ulong uVar12;
  unsigned_long *value;
  size_type __n;
  unsigned_long *__args;
  size_type sVar13;
  double dVar14;
  vector<unsigned_long,_true> current_vector_sample;
  vector<unsigned_short,_true> current_vector_null_positions;
  UnifiedVectorFormat vdata;
  allocator_type local_d1;
  double local_d0;
  data_ptr_t local_c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c0;
  ulong local_a8;
  size_type local_a0;
  value_type_conflict local_98;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_90;
  UnifiedVectorFormat local_78;
  
  pp_Var1 = state[1]._vptr_AnalyzeState;
  if ((ulong)((long)pp_Var1 * 0x6db6db6db6db6db7) < 0x2492492492492493) {
    pp_Var2 = state[2]._vptr_AnalyzeState;
    state[1].info.block_manager =
         (BlockManager *)((long)&(state[1].info.block_manager)->_vptr_BlockManager + count);
    state[1]._vptr_AnalyzeState = (_func_int **)((long)pp_Var1 + 1);
    if ((0x1f < count) || (pp_Var2 == (_func_int **)0x0)) {
      UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
      Vector::ToUnifiedFormat(input,count,&local_78);
      local_c8 = local_78.data;
      val = 0x400;
      if (count < 0x400) {
        val = count;
      }
      uVar4 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(val);
      uVar9 = (ulong)uVar4;
      local_d0 = (double)uVar9;
      dVar14 = ceil(local_d0 * 0.03125);
      uVar11 = 1;
      if (1 < (uint)(long)dVar14) {
        uVar11 = (long)dVar14 & 0xffffffff;
      }
      local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start._0_2_ = 0;
      ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                (&local_90,uVar9,(value_type_conflict8 *)&local_c0,(allocator_type *)&local_98);
      dVar14 = ceil(local_d0 / (double)uVar11);
      uVar12 = (long)dVar14 & 0xffffffff;
      local_98 = 0;
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_c0,uVar12,&local_98,&local_d1);
      local_d0 = (double)uVar11;
      if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        if (uVar4 != 0) {
          sVar13 = 0;
          uVar12 = 0;
          do {
            uVar7 = uVar12;
            if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
              uVar7 = (ulong)(local_78.sel)->sel_vector[uVar12];
            }
            vVar3 = *(value_type *)(local_c8 + uVar7 * 8);
            pvVar5 = vector<unsigned_long,_true>::operator[]
                               ((vector<unsigned_long,_true> *)&local_c0,sVar13);
            *pvVar5 = vVar3;
            sVar13 = sVar13 + 1;
            uVar12 = uVar12 + (long)local_d0;
          } while ((uVar9 - 1) / uVar11 + 1 != sVar13);
        }
      }
      else {
        local_a8 = uVar12;
        if (uVar4 == 0) {
          __n = 0;
        }
        else {
          sVar13 = 0;
          local_a0 = (uVar9 - 1) / uVar11 + 1;
          uVar9 = 0;
          __n = 0;
          do {
            uVar11 = uVar9;
            if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
              uVar11 = (ulong)(local_78.sel)->sel_vector[uVar9];
            }
            vVar3 = *(value_type *)(local_c8 + uVar11 * 8);
            pvVar5 = vector<unsigned_long,_true>::operator[]
                               ((vector<unsigned_long,_true> *)&local_c0,sVar13);
            *pvVar5 = vVar3;
            if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              uVar11 = 0;
            }
            else {
              uVar11 = (ulong)((local_78.validity.super_TemplatedValidityMask<unsigned_long>.
                                validity_mask[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) == 0);
            }
            pvVar6 = vector<unsigned_short,_true>::operator[]
                               ((vector<unsigned_short,_true> *)&local_90,__n);
            *pvVar6 = (value_type)sVar13;
            __n = uVar11 + __n;
            sVar13 = sVar13 + 1;
            uVar9 = uVar9 + (long)local_d0;
          } while (local_a0 != sVar13);
        }
        if (__n != 0) {
          uVar8 = 0;
          if (local_a8 != 0) {
            uVar9 = 0;
            do {
              if (uVar9 != local_90.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar9]) {
                uVar8 = *(undefined8 *)
                         (CONCAT62(local_c0.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start._2_6_,
                                   local_c0.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start._0_2_) + uVar9 * 8);
                break;
              }
              uVar9 = uVar9 + 1;
            } while (local_a8 != uVar9);
          }
          sVar10 = 0;
          do {
            *(undefined8 *)
             (CONCAT62(local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start._2_6_,
                       local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start._0_2_) +
             (ulong)local_90.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start[sVar10] * 8) = uVar8;
            sVar10 = sVar10 + 1;
          } while (__n != sVar10);
        }
      }
      __args = (unsigned_long *)
               CONCAT62(local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start._2_6_,
                        local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start._0_2_);
      if (__args != local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
        do {
          __position._M_current = (unsigned_long *)state[3]._vptr_AnalyzeState;
          if ((BlockManager *)__position._M_current == state[3].info.block_manager) {
            ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&state[2].info,
                       __position,__args);
          }
          else {
            *__position._M_current = *__args;
            state[3]._vptr_AnalyzeState = (_func_int **)(__position._M_current + 1);
          }
          __args = __args + 1;
        } while (__args != local_c0.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish);
      }
      state[2]._vptr_AnalyzeState = (_func_int **)((long)state[2]._vptr_AnalyzeState + 1);
      if ((void *)CONCAT62(local_c0.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start._2_6_,
                           local_c0.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start._0_2_) != (void *)0x0) {
        operator_delete((void *)CONCAT62(local_c0.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_start._2_6_,
                                         local_c0.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_start._0_2_));
      }
      if (local_90.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_78.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
    }
  }
  else {
    state[1]._vptr_AnalyzeState = (_func_int **)((long)pp_Var1 + 1);
    state[1].info.block_manager =
         (BlockManager *)((long)&(state[1].info.block_manager)->_vptr_BlockManager + count);
  }
  return true;
}

Assistant:

bool AlpRDAnalyze(AnalyzeState &state, Vector &input, idx_t count) {
	using EXACT_TYPE = typename FloatingToExact<T>::TYPE;
	auto &analyze_state = (AlpRDAnalyzeState<T> &)state;

	bool must_skip_current_vector = alp::AlpUtils::MustSkipSamplingFromCurrentVector(
	    analyze_state.vectors_count, analyze_state.vectors_sampled_count, count);
	analyze_state.vectors_count += 1;
	analyze_state.total_values_count += count;
	if (must_skip_current_vector) {
		return true;
	}

	UnifiedVectorFormat vdata;
	input.ToUnifiedFormat(count, vdata);
	auto data = UnifiedVectorFormat::GetData<T>(vdata);

	alp::AlpSamplingParameters sampling_params = alp::AlpUtils::GetSamplingParameters(count);

	vector<uint16_t> current_vector_null_positions(sampling_params.n_lookup_values, 0);
	vector<EXACT_TYPE> current_vector_sample(sampling_params.n_sampled_values, 0);

	// Storing the sample of that vector
	idx_t sample_idx = 0;
	idx_t nulls_idx = 0;
	// We optimize by doing a different loop when there are no nulls
	if (vdata.validity.AllValid()) {
		for (idx_t i = 0; i < sampling_params.n_lookup_values; i += sampling_params.n_sampled_increments) {
			auto idx = vdata.sel->get_index(i);
			EXACT_TYPE value = Load<EXACT_TYPE>(const_data_ptr_cast(&data[idx]));
			current_vector_sample[sample_idx] = value;
			sample_idx++;
		}
	} else {
		for (idx_t i = 0; i < sampling_params.n_lookup_values; i += sampling_params.n_sampled_increments) {
			auto idx = vdata.sel->get_index(i);
			EXACT_TYPE value = Load<EXACT_TYPE>(const_data_ptr_cast(&data[idx]));
			current_vector_sample[sample_idx] = value;
			//! We resolve null values with a predicated comparison
			bool is_null = !vdata.validity.RowIsValid(idx);
			current_vector_null_positions[nulls_idx] = UnsafeNumericCast<uint16_t>(sample_idx);
			nulls_idx += is_null;
			sample_idx++;
		}
		alp::AlpUtils::FindAndReplaceNullsInVector<EXACT_TYPE>(current_vector_sample.data(),
		                                                       current_vector_null_positions.data(),
		                                                       sampling_params.n_sampled_values, nulls_idx);
	}

	D_ASSERT(sample_idx == sampling_params.n_sampled_values);

	// Pushing the sampled vector samples into the rowgroup samples
	for (auto &value : current_vector_sample) {
		analyze_state.rowgroup_sample.push_back(value);
	}

	analyze_state.vectors_sampled_count++;
	return true;
}